

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutil.cpp
# Opt level: O2

string * trim(string *str,string *chars)

{
  string *psVar1;
  
  rtrim(str,chars);
  psVar1 = ltrim(str,chars);
  return psVar1;
}

Assistant:

std::string& trim(std::string& str, const std::string& chars) {
  return ltrim(rtrim(str, chars), chars);
}